

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_interface.c
# Opt level: O0

int fe_mfcc_to_float(fe_t *fe,mfcc_t **input,float32 **output,int32 nframes)

{
  int local_30;
  int32 i;
  int32 nframes_local;
  float32 **output_local;
  mfcc_t **input_local;
  fe_t *fe_local;
  
  if (input == output) {
    fe_local._4_4_ = nframes * (uint)fe->feature_dimension;
  }
  else {
    for (local_30 = 0; local_30 < (int)(nframes * (uint)fe->feature_dimension);
        local_30 = local_30 + 1) {
      (*output)[local_30] = (*input)[local_30];
    }
    fe_local._4_4_ = local_30;
  }
  return fe_local._4_4_;
}

Assistant:

int32
fe_mfcc_to_float(fe_t * fe,
                 mfcc_t ** input, float32 ** output, int32 nframes)
{
    int32 i;

#ifndef FIXED_POINT
    if ((void *) input == (void *) output)
        return nframes * fe->feature_dimension;
#endif
    for (i = 0; i < nframes * fe->feature_dimension; ++i)
        output[0][i] = MFCC2FLOAT(input[0][i]);

    return i;
}